

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

string * __thiscall
absl::StrCat<std::__cxx11::string,char[2],std::__cxx11::string>
          (string *__return_storage_ptr__,absl *this,string_view first,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest,char (*rest_1) [2]
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_1_00;
  string_view first_00;
  string local_60;
  string local_40;
  
  rest_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rest_1;
  StrCat_abi_cxx11_(&local_40,this,first);
  first_00._M_str = (char *)rest;
  first_00._M_len = *(size_t *)first._M_str;
  StrCat<char[2],std::__cxx11::string>
            (&local_60,*(absl **)((long)first._M_str + 8),first_00,rest_1,rest_1_00);
  std::operator+(__return_storage_ptr__,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline std::string StrCat(absl::string_view first, const T &...rest) {
  return StrCat(first) + StrCat(rest...);
}